

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CombinationFederate.cpp
# Opt level: O3

string * __thiscall
helics::CombinationFederate::localQuery_abi_cxx11_
          (string *__return_storage_ptr__,CombinationFederate *this,string_view queryStr)

{
  string local_40;
  
  helics::ValueFederate::localQuery_abi_cxx11_
            (__return_storage_ptr__,&this->super_ValueFederate,(string_view)queryStr);
  if (__return_storage_ptr__->_M_string_length == 0) {
    helics::MessageFederate::localQuery_abi_cxx11_
              (&local_40,(MessageFederate *)&(this->super_ValueFederate).field_0x10,queryStr);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CombinationFederate::localQuery(std::string_view queryStr) const
{
    std::string res = ValueFederate::localQuery(queryStr);
    if (res.empty()) {
        res = MessageFederate::localQuery(queryStr);
    }
    return res;
}